

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeStiffnessMatrix(ChElementTetraCorot_10 *this)

{
  ChMatrixDynamic<> *dst;
  double *pdVar1;
  pointer pMVar2;
  element_type *peVar3;
  long lVar4;
  double *pdVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  Index index;
  long lVar18;
  ActualDstType actualDst_1;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  double JacobianDet;
  ChMatrixDynamic<> temp;
  ChMatrixNM<double,_4,_4> tmp;
  assign_op<double,_double> local_18b;
  ushort local_18a;
  double local_188;
  Matrix<double,__1,__1,_1,__1,__1> local_180;
  Matrix<double,__1,__1,_1,__1,__1> local_160;
  SrcXprType local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  uVar14 = (**(code **)(*(long *)&((((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  uVar19 = CONCAT71((int7)((ulong)uVar14 >> 8),7) & 0xffffffff;
  auVar20._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * local_140.m_lhs.m_rows.m_value;
  auVar20._0_8_ = (ulong)((byte)uVar19 & 1) * local_140._0_8_;
  auVar20._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * local_140.m_lhs.m_cols.m_value;
  auVar20._24_8_ = 0;
  local_18a = (ushort)uVar19;
  vscatterqpd_avx512vl(ZEXT832(&local_100) + _DAT_009840e0,uVar19,auVar20);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar21._8_8_ = (ulong)((byte)(local_18a >> 1) & 1) * local_140.m_lhs.m_rows.m_value;
  auVar21._0_8_ = (ulong)((byte)local_18a & 1) * local_140._0_8_;
  auVar21._16_8_ = (ulong)((byte)(local_18a >> 2) & 1) * local_140.m_lhs.m_cols.m_value;
  auVar21._24_8_ = (ulong)((byte)(local_18a >> 3) & 1) * (long)local_140.m_lhs.m_functor.m_other;
  vscatterqpd_avx512vl(ZEXT832(&local_100) + ZEXT832(8) + _DAT_009840e0,(ulong)local_18a,auVar21);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar22._8_8_ = (ulong)((byte)(local_18a >> 1) & 1) * local_140.m_lhs.m_rows.m_value;
  auVar22._0_8_ = (ulong)((byte)local_18a & 1) * local_140._0_8_;
  auVar22._16_8_ = (ulong)((byte)(local_18a >> 2) & 1) * local_140.m_lhs.m_cols.m_value;
  auVar22._24_8_ = (ulong)((byte)(local_18a >> 3) & 1) * (long)local_140.m_lhs.m_functor.m_other;
  vscatterqpd_avx512vl(ZEXT832(&local_100) + ZEXT832(0x10) + _DAT_009840e0,(ulong)local_18a,auVar22)
  ;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar23._8_8_ = (ulong)((byte)(local_18a >> 1) & 1) * local_140.m_lhs.m_rows.m_value;
  auVar23._0_8_ = (ulong)((byte)local_18a & 1) * local_140._0_8_;
  auVar23._16_8_ = (ulong)((byte)(local_18a >> 2) & 1) * local_140.m_lhs.m_cols.m_value;
  auVar23._24_8_ = (ulong)((byte)(local_18a >> 3) & 1) * (long)local_140.m_lhs.m_functor.m_other;
  vscatterqpd_avx512vl(ZEXT832(&local_100) + ZEXT832(0x18) + _DAT_009840e0,(ulong)local_18a,auVar23)
  ;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = 1.0;
  local_140._0_8_ = &local_100;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->mM,(SrcXprType *)&local_140,(assign_op<double,_double> *)&local_180);
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_188);
  pMVar2 = (this->MatrB).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (this->Material).
           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar18 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
           m_rows;
  if (lVar18 == (peVar3->StressStrainMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows) {
    if ((peVar3->StressStrainMatrix).
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols != lVar18)
    {
LAB_006a9c72:
      pcVar17 = 
      "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
      ;
      goto LAB_006a9c87;
    }
    lVar18 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_cols;
    if (-1 < lVar18) {
      local_140.m_rhs.m_lhs.m_rhs = &peVar3->StressStrainMatrix;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
           0;
      local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           0;
      local_140.m_lhs.m_rows.m_value = lVar18;
      local_140.m_lhs.m_cols.m_value = lVar18;
      local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2;
      local_140.m_rhs.m_rhs = pMVar2;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_180,&local_140,&local_18b);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_160,&local_180,&local_18b);
      if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data[-1]);
      }
      dst = &this->StiffnessMatrix;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                (dst,&local_160,(assign_op<double,_double> *)&local_140);
      (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
                (0x3fc1b06d1ab58dec,0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
                 (this->MatrB).
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,&local_188);
      pMVar2 = (this->MatrB).
               super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      lVar18 = pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows;
      if (lVar18 != (peVar3->StressStrainMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_rows) goto LAB_006a9c5b;
      if ((peVar3->StressStrainMatrix).
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
          lVar18) goto LAB_006a9c72;
      lVar18 = pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_cols;
      if (-1 < lVar18) {
        local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 1;
        local_140.m_rhs.m_lhs.m_rhs = &peVar3->StressStrainMatrix;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
             = 0;
        local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
             = 0;
        local_140.m_lhs.m_rows.m_value = lVar18;
        local_140.m_lhs.m_cols.m_value = lVar18;
        local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_180,&local_140,&local_18b);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (&local_160,&local_180,&local_18b);
        if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_data != (double *)0x0) {
          free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_data[-1]);
        }
        lVar18 = (this->StiffnessMatrix).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
        if ((lVar18 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_rows) ||
           (lVar4 = (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols,
           lVar4 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols)) {
LAB_006a9c3c:
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                       );
        }
        uVar15 = lVar4 * lVar18;
        pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                 m_data;
        uVar19 = uVar15 + 7;
        if (-1 < (long)uVar15) {
          uVar19 = uVar15;
        }
        uVar19 = uVar19 & 0xfffffffffffffff8;
        if (7 < (long)uVar15) {
          lVar18 = 0;
          do {
            auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])
                                      (local_160.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                       .m_storage.m_data + lVar18),
                                     *(undefined1 (*) [64])(pdVar5 + lVar18));
            *(undefined1 (*) [64])(pdVar5 + lVar18) = auVar24;
            lVar18 = lVar18 + 8;
          } while (lVar18 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar15) {
          do {
            pdVar5[uVar19] =
                 local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data[uVar19] + pdVar5[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar15 - uVar19 != 0);
        }
        (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
                  (this,(this->MatrB).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2,&local_188);
        pMVar2 = (this->MatrB).
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar3 = (this->Material).
                 super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar18 = pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        if (lVar18 != (peVar3->StressStrainMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_rows) goto LAB_006a9c5b;
        if ((peVar3->StressStrainMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
            lVar18) goto LAB_006a9c72;
        lVar18 = pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
        if (-1 < lVar18) {
          local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 2;
          local_140.m_rhs.m_lhs.m_rhs = &peVar3->StressStrainMatrix;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols = 0;
          local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = 0;
          local_140.m_lhs.m_rows.m_value = lVar18;
          local_140.m_lhs.m_cols.m_value = lVar18;
          local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(&local_180,&local_140,&local_18b);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (&local_160,&local_180,&local_18b);
          if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data != (double *)0x0) {
            free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_data[-1]);
          }
          lVar18 = (this->StiffnessMatrix).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
          ;
          if ((lVar18 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_rows) ||
             (lVar4 = (this->StiffnessMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols,
             lVar4 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols)) goto LAB_006a9c3c;
          uVar15 = lVar4 * lVar18;
          pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                   .m_data;
          uVar19 = uVar15 + 7;
          if (-1 < (long)uVar15) {
            uVar19 = uVar15;
          }
          uVar19 = uVar19 & 0xfffffffffffffff8;
          if (7 < (long)uVar15) {
            lVar18 = 0;
            do {
              auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])
                                        (local_160.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                         .m_storage.m_data + lVar18),
                                       *(undefined1 (*) [64])(pdVar5 + lVar18));
              *(undefined1 (*) [64])(pdVar5 + lVar18) = auVar24;
              lVar18 = lVar18 + 8;
            } while (lVar18 < (long)uVar19);
          }
          if ((long)uVar19 < (long)uVar15) {
            do {
              pdVar5[uVar19] =
                   local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data[uVar19] + pdVar5[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar15 - uVar19 != 0);
          }
          (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
                    (this,(this->MatrB).
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 3,&local_188);
          pMVar2 = (this->MatrB).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          peVar3 = (this->Material).
                   super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar18 = pMVar2[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
          if (lVar18 != (peVar3->StressStrainMatrix).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_rows) goto LAB_006a9c5b;
          if ((peVar3->StressStrainMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
              lVar18) goto LAB_006a9c72;
          lVar18 = pMVar2[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols;
          if (-1 < lVar18) {
            local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 3;
            local_140.m_rhs.m_lhs.m_rhs = &peVar3->StressStrainMatrix;
            local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols = 0;
            local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
            local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_data = (double *)0x0;
            local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows = 0;
            local_140.m_lhs.m_rows.m_value = lVar18;
            local_140.m_lhs.m_cols.m_value = lVar18;
            local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
            Eigen::internal::
            Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
            ::run(&local_180,&local_140,&local_18b);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                      (&local_160,&local_180,&local_18b);
            if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data != (double *)0x0) {
              free((void *)local_180.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            lVar18 = (this->StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows;
            if ((lVar18 != local_160.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows) ||
               (lVar4 = (this->StiffnessMatrix).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols,
               lVar4 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                        m_storage.m_cols)) goto LAB_006a9c3c;
            uVar15 = lVar4 * lVar18;
            pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                     m_storage.m_data;
            uVar19 = uVar15 + 7;
            if (-1 < (long)uVar15) {
              uVar19 = uVar15;
            }
            uVar19 = uVar19 & 0xfffffffffffffff8;
            if (7 < (long)uVar15) {
              lVar18 = 0;
              do {
                auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])
                                          (local_160.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           .m_storage.m_data + lVar18),
                                         *(undefined1 (*) [64])(pdVar5 + lVar18));
                *(undefined1 (*) [64])(pdVar5 + lVar18) = auVar24;
                lVar18 = lVar18 + 8;
              } while (lVar18 < (long)uVar19);
            }
            if ((long)uVar19 < (long)uVar15) {
              do {
                pdVar5[uVar19] =
                     local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data[uVar19] + pdVar5[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar15 - uVar19 != 0);
            }
            uVar19 = (this->StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols;
            uVar15 = (this->StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows;
            if (-1 < (long)(uVar19 | uVar15)) {
              uVar19 = uVar19 * uVar15;
              pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_data;
              uVar15 = uVar19 + 7;
              if (-1 < (long)uVar19) {
                uVar15 = uVar19;
              }
              uVar15 = uVar15 & 0xfffffffffffffff8;
              if (7 < (long)uVar19) {
                auVar24 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
                lVar18 = 0;
                do {
                  auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])(pdVar5 + lVar18));
                  *(undefined1 (*) [64])(pdVar5 + lVar18) = auVar25;
                  lVar18 = lVar18 + 8;
                } while (lVar18 < (long)uVar15);
              }
              if ((long)uVar19 % 8 != 0 && (long)uVar15 <= (long)uVar19) {
                auVar24 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
                auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar26 = vpbroadcastq_avx512f();
                uVar16 = 0;
                do {
                  auVar27 = vpbroadcastq_avx512f();
                  auVar27 = vporq_avx512f(auVar27,auVar25);
                  uVar13 = vpcmpuq_avx512f(auVar27,auVar26,2);
                  pdVar1 = pdVar5 + uVar15 + uVar16;
                  auVar27._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
                  auVar27._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
                  auVar27._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
                  auVar27._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
                  auVar27._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
                  auVar27._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
                  auVar27._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
                  auVar27._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
                  auVar27 = vmulpd_avx512f(auVar27,auVar24);
                  pdVar1 = pdVar5 + uVar15 + uVar16;
                  bVar6 = (bool)((byte)uVar13 & 1);
                  bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
                  bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
                  bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
                  bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                  bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
                  *pdVar1 = (double)((ulong)bVar6 * auVar27._0_8_ | (ulong)!bVar6 * (long)*pdVar1);
                  pdVar1[1] = (double)((ulong)bVar7 * auVar27._8_8_ |
                                      (ulong)!bVar7 * (long)pdVar1[1]);
                  pdVar1[2] = (double)((ulong)bVar8 * auVar27._16_8_ |
                                      (ulong)!bVar8 * (long)pdVar1[2]);
                  pdVar1[3] = (double)((ulong)bVar9 * auVar27._24_8_ |
                                      (ulong)!bVar9 * (long)pdVar1[3]);
                  pdVar1[4] = (double)((ulong)bVar10 * auVar27._32_8_ |
                                      (ulong)!bVar10 * (long)pdVar1[4]);
                  pdVar1[5] = (double)((ulong)bVar11 * auVar27._40_8_ |
                                      (ulong)!bVar11 * (long)pdVar1[5]);
                  pdVar1[6] = (double)((ulong)bVar12 * auVar27._48_8_ |
                                      (ulong)!bVar12 * (long)pdVar1[6]);
                  pdVar1[7] = (double)((uVar13 >> 7) * auVar27._56_8_ |
                                      (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar1[7]);
                  uVar16 = uVar16 + 8;
                } while (((long)uVar19 % 8 + 7U & 0xfffffffffffffff8) != uVar16);
              }
              if (local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data != (double *)0x0) {
                free((void *)local_160.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_data[-1]);
              }
              return;
            }
            pcVar17 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
            ;
            goto LAB_006a9ca6;
          }
        }
      }
    }
    pcVar17 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
    ;
LAB_006a9ca6:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar17);
  }
LAB_006a9c5b:
  pcVar17 = 
  "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
  ;
LAB_006a9c87:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar17);
}

Assistant:

void ChElementTetraCorot_10::ComputeStiffnessMatrix() {
    // for speeding up corotational, used later:
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    //========================
    // Exact Integration (4 Gp)
    //========================
    ChMatrixDynamic<> temp;

    double zeta1 = 0.58541020;
    double zeta2 = 0.1381966;
    double zeta3 = 0.1381966;
    double zeta4 = 0.1381966;
    double JacobianDet;
    ComputeMatrB(this->MatrB[0], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[0].transpose() * Material->Get_StressStrainMatrix() * MatrB[0]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix = temp;

    zeta1 = 0.1381966;
    zeta2 = 0.58541020;
    zeta3 = 0.1381966;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[1], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[1].transpose() * Material->Get_StressStrainMatrix() * MatrB[1]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.58541020;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[2], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[2].transpose() * Material->Get_StressStrainMatrix() * MatrB[2]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.1381966;
    zeta4 = 0.58541020;
    ComputeMatrB(this->MatrB[3], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[3].transpose() * Material->Get_StressStrainMatrix() * MatrB[3]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    StiffnessMatrix /= 2;  //!!! => because the canonical interval is -1 ... +1,  but we want to integrate
                           //		 in 0 ... +1 -> we have to multiply by: b-a/2 ( = (1-0)/2 = 1/2)
}